

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O3

void __thiscall
Assimp::AMFImporter::Postprocess_BuildMaterial
          (AMFImporter *this,CAMFImporter_NodeElement_Material *pMaterial)

{
  size_t *psVar1;
  list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
  *plVar2;
  list<Assimp::AMFImporter::SPP_Composite,_std::allocator<Assimp::AMFImporter::SPP_Composite>_>
  *this_00;
  int iVar3;
  CAMFImporter_NodeElement_Color *pCVar4;
  _List_node_base *p_Var5;
  _Node *p_Var6;
  _List_node_base *p_Var7;
  SPP_Material new_mat;
  SPP_Material local_88;
  
  local_88.ID._M_dataplus._M_p = (pointer)&local_88.ID.field_2;
  local_88.ID._M_string_length = 0;
  local_88.ID.field_2._M_local_buf[0] = '\0';
  plVar2 = &local_88.Metadata;
  local_88.Metadata.
  super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
  ._M_impl._M_node._M_size = 0;
  this_00 = &local_88.Composition;
  local_88.Composition.
  super__List_base<Assimp::AMFImporter::SPP_Composite,_std::allocator<Assimp::AMFImporter::SPP_Composite>_>
  ._M_impl._M_node._M_size = 0;
  local_88.Metadata.
  super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar2;
  local_88.Metadata.
  super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
  local_88.Composition.
  super__List_base<Assimp::AMFImporter::SPP_Composite,_std::allocator<Assimp::AMFImporter::SPP_Composite>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  local_88.Composition.
  super__List_base<Assimp::AMFImporter::SPP_Composite,_std::allocator<Assimp::AMFImporter::SPP_Composite>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  std::__cxx11::string::_M_assign((string *)&local_88);
  for (p_Var7 = (pMaterial->super_CAMFImporter_NodeElement).Child.
                super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var7 != (_List_node_base *)&(pMaterial->super_CAMFImporter_NodeElement).Child;
      p_Var7 = p_Var7->_M_next) {
    pCVar4 = (CAMFImporter_NodeElement_Color *)p_Var7[1]._M_next;
    iVar3 = (pCVar4->super_CAMFImporter_NodeElement).Type;
    if (iVar3 == 6) {
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = (_List_node_base *)pCVar4;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      local_88.Metadata.
      super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
      ._M_impl._M_node._M_size =
           local_88.Metadata.
           super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
           ._M_impl._M_node._M_size + 1;
    }
    else if (iVar3 == 0) {
      local_88.Color = pCVar4;
    }
  }
  p_Var6 = std::__cxx11::
           list<Assimp::AMFImporter::SPP_Material,std::allocator<Assimp::AMFImporter::SPP_Material>>
           ::_M_create_node<Assimp::AMFImporter::SPP_Material_const&>
                     ((list<Assimp::AMFImporter::SPP_Material,std::allocator<Assimp::AMFImporter::SPP_Material>>
                       *)&this->mMaterial_Converted,&local_88);
  std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
  psVar1 = &(this->mMaterial_Converted).
            super__List_base<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  std::__cxx11::
  _List_base<Assimp::AMFImporter::SPP_Composite,_std::allocator<Assimp::AMFImporter::SPP_Composite>_>
  ::_M_clear(&this_00->
              super__List_base<Assimp::AMFImporter::SPP_Composite,_std::allocator<Assimp::AMFImporter::SPP_Composite>_>
            );
  p_Var7 = local_88.Metadata.
           super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var7 != (_List_node_base *)plVar2) {
    p_Var5 = (((_List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
                *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var7,0x18);
    p_Var7 = p_Var5;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.ID._M_dataplus._M_p != &local_88.ID.field_2) {
    operator_delete(local_88.ID._M_dataplus._M_p,
                    CONCAT71(local_88.ID.field_2._M_allocated_capacity._1_7_,
                             local_88.ID.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void AMFImporter::Postprocess_BuildMaterial(const CAMFImporter_NodeElement_Material& pMaterial)
{
SPP_Material new_mat;

	new_mat.ID = pMaterial.ID;
	for(const CAMFImporter_NodeElement* mat_child: pMaterial.Child)
	{
		if(mat_child->Type == CAMFImporter_NodeElement::ENET_Color)
		{
			new_mat.Color = (CAMFImporter_NodeElement_Color*)mat_child;
		}
		else if(mat_child->Type == CAMFImporter_NodeElement::ENET_Metadata)
		{
			new_mat.Metadata.push_back((CAMFImporter_NodeElement_Metadata*)mat_child);
		}
	}// for(const CAMFImporter_NodeElement* mat_child; pMaterial.Child)

	// place converted material to special list
	mMaterial_Converted.push_back(new_mat);
}